

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stereo_calib.cpp
# Opt level: O3

void StereoCalib(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *imagelist,Size *boardSize,float squareSize,bool displayCorners,bool useCalibrated,
                bool showRectified)

{
  uchar *puVar1;
  pointer pPVar2;
  pointer pPVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  bool bVar7;
  char cVar8;
  byte bVar9;
  double dVar10;
  ostream *poVar11;
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  *pvVar12;
  FileStorage *pFVar13;
  undefined8 uVar14;
  undefined7 in_register_00000011;
  vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_> *pvVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  undefined8 *puVar20;
  pointer pvVar21;
  ulong uVar22;
  double dVar23;
  ulong uVar24;
  Rect *pRVar25;
  int iVar26;
  Mat *pMVar27;
  Mat (*paMVar28) [2];
  uchar **ppuVar29;
  int iVar30;
  ulong uVar31;
  Mat *pMVar32;
  int iVar33;
  int iVar34;
  Mat *this;
  bool bVar35;
  __m128d t;
  _InputArray local_c18;
  double local_c00;
  _OutputArray local_bf8;
  undefined8 uStack_be0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_bd8;
  undefined8 uStack_bd0;
  double local_bc8;
  undefined8 uStack_bc0;
  long local_bb8;
  undefined8 uStack_bb0;
  ulong local_ba8;
  undefined4 local_b9c;
  int local_b98;
  int local_b94;
  int local_b90 [3];
  int local_b84;
  int local_b80 [3];
  int local_b74;
  undefined4 local_b70;
  int local_b6c;
  int local_b68;
  int local_b64;
  undefined4 local_b60;
  int local_b5c;
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  imagePoints [2];
  Mat rmap [2] [2];
  Mat R1;
  int local_948;
  int local_944;
  int local_940;
  int local_93c;
  int local_938;
  int local_934;
  int local_930;
  int local_92c;
  vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  objectPoints;
  Mat canvas;
  Mat rimg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  goodImageList;
  undefined8 local_828;
  undefined8 local_820;
  Size local_818;
  undefined8 local_810;
  undefined8 local_808;
  undefined8 local_800;
  Mat img_1;
  Mat canvasPart_orig;
  Mat canvas_orig;
  Mat R;
  Mat distCoeffs [2];
  _InputArray local_5a0;
  Mat cimg;
  Rect validRoi [2];
  FileStorage fs;
  Mat canvasPart;
  vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_> lines [2];
  Mat P1;
  Mat R2;
  Mat P2;
  Mat gimg;
  Mat Q;
  Mat cameraMatrix [2];
  Mat T;
  Mat F;
  Mat E;
  
  uVar31 = (long)(imagelist->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(imagelist->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  if ((uVar31 & 0x20) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Error: the image list contains odd (non-even) number of elements\n",0x41);
    return;
  }
  imagePoints[0].
  super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT416(0);
  objectPoints.
  super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar30 = (int)(uVar31 >> 5) >> 1;
  dVar23 = (double)(long)iVar30;
  imagePoints._16_16_ =
       imagePoints[0].
       super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
       ._M_impl.super__Vector_impl_data._0_16_;
  imagePoints[1].
  super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._8_16_ =
       imagePoints[0].
       super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
       ._M_impl.super__Vector_impl_data._0_16_;
  objectPoints.
  super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ =
       imagePoints[0].
       super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
       ._M_impl.super__Vector_impl_data._0_16_;
  std::
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ::resize(imagePoints,(size_type)dVar23);
  std::
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ::resize(imagePoints + 1,(size_type)dVar23);
  local_b9c = (undefined4)CONCAT71(in_register_00000011,displayCorners);
  goodImageList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  goodImageList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  goodImageList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (iVar30 < 1) {
    iVar30 = 0;
    iVar34 = 0;
    uVar17 = 0;
  }
  else {
    dVar10 = 0.0;
    uVar17 = 0;
    iVar34 = 0;
    iVar30 = 0;
    local_bd8 = imagelist;
    do {
      local_bb8 = CONCAT44(local_bb8._4_4_,uVar17);
      local_c00 = (double)((long)dVar10 << 6);
      pvVar12 = imagePoints;
      lVar16 = 0;
      local_bc8 = dVar10;
      bVar35 = true;
      do {
        bVar7 = bVar35;
        puVar20 = (undefined8 *)
                  ((long)&(local_bd8->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[lVar16]._M_dataplus._M_p +
                  (long)local_c00);
        cv::imread((string *)rmap,(int)puVar20);
        cVar8 = cv::Mat::empty();
        if (cVar8 != '\0') {
LAB_00105173:
          cv::Mat::~Mat(rmap[0]);
          uVar17 = (uint)local_bb8;
          goto LAB_0010518a;
        }
        iVar33 = rmap[0][0].size.p[1];
        iVar19 = *rmap[0][0].size.p;
        if ((iVar30 != 0 || iVar34 != 0) &&
           ((rmap[0][0].size.p[1] != iVar30 ||
            (iVar33 = iVar30, iVar19 = iVar34, *rmap[0][0].size.p != iVar34)))) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"The image ",10);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)*puVar20,puVar20[1]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,
                     " has the size different from the first image size. Skipping the pair\n",0x45);
          goto LAB_00105173;
        }
        iVar34 = iVar19;
        iVar30 = iVar33;
        pvVar21 = (pvVar12->
                  super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + (int)uVar17;
        iVar33 = 1;
        while( true ) {
          cv::Mat::Mat(cameraMatrix);
          if (iVar33 == 1) {
            cv::Mat::operator=(cameraMatrix,rmap[0]);
          }
          else {
            distCoeffs[0].data = (uchar *)0x0;
            distCoeffs[0].flags = 0x1010000;
            distCoeffs[0]._8_8_ = rmap;
            R.data = (uchar *)0x0;
            R.flags = 0x2010000;
            local_800 = 0;
            R._8_8_ = cameraMatrix;
            cv::resize(distCoeffs,&R,&local_800);
          }
          distCoeffs[0].data = (uchar *)0x0;
          distCoeffs[0].flags = 0x1010000;
          local_818 = *boardSize;
          R.data = (uchar *)0x0;
          R.flags = -0x7dfcfff3;
          R._8_8_ = pvVar21;
          distCoeffs[0]._8_8_ = cameraMatrix;
          cVar8 = cv::findChessboardCorners(distCoeffs,&local_818,&R);
          if (cVar8 != '\0') break;
          cv::Mat::~Mat(cameraMatrix);
          bVar35 = iVar33 == 0;
          iVar33 = iVar33 + -1;
          if (bVar35) {
            putchar(0x2e);
            goto LAB_00105173;
          }
        }
        if (iVar33 == 0) {
          distCoeffs[0].flags = 0x42ff400d;
          distCoeffs[0].dims = 2;
          uVar31 = (long)*(pointer *)
                          ((long)&(pvVar21->
                                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                  )._M_impl.super__Vector_impl_data + 8) -
                   *(long *)&(pvVar21->
                             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                             )._M_impl.super__Vector_impl_data;
          distCoeffs[0].cols = 1;
          distCoeffs[0].rows = (int)(uVar31 >> 3);
          distCoeffs[0].size.p = &distCoeffs[0].rows;
          distCoeffs[0].allocator = (MatAllocator *)0x0;
          distCoeffs[0].u = (UMatData *)0x0;
          distCoeffs[0].datalimit = (uchar *)0x0;
          distCoeffs[0].datastart = (uchar *)0x0;
          distCoeffs[0].step.p = distCoeffs[0].step.buf;
          distCoeffs[0].step.buf[0] = 0;
          distCoeffs[0].step.buf[1] = 0;
          pPVar2 = (pvVar21->
                   super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (pPVar2 != *(pointer *)
                         ((long)&(pvVar21->
                                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                 )._M_impl.super__Vector_impl_data + 8)) {
            distCoeffs[0].step.buf[1] = 8;
            distCoeffs[0].step.buf[0] = 8;
            distCoeffs[0].datalimit =
                 (uchar *)((long)&pPVar2->x +
                          ((long)(uVar31 * 0x20000000) >> 0x1d & 0xfffffffffffffff8U));
            distCoeffs[0].datastart = (uchar *)pPVar2;
          }
          R.data = (uchar *)0x0;
          R.flags = 0x2010000;
          R._8_8_ = distCoeffs;
          distCoeffs[0].data = distCoeffs[0].datastart;
          distCoeffs[0].dataend = distCoeffs[0].datalimit;
          cv::Mat::convertTo((_OutputArray *)distCoeffs,(int)&R,0.5,0.0);
          cv::Mat::~Mat(distCoeffs);
        }
        cv::Mat::~Mat(cameraMatrix);
        putchar(0x2e);
        cameraMatrix[0].data = (uchar *)0x0;
        cameraMatrix[0].flags = 0x1010000;
        distCoeffs[0].data = (uchar *)0x0;
        distCoeffs[0].flags = -0x7cfcfff3;
        local_808 = 0xb0000000b;
        local_810 = 0xffffffffffffffff;
        distCoeffs[0]._8_8_ = pvVar21;
        cameraMatrix[0]._8_8_ = rmap[0];
        cv::cornerSubPix(0x3f847ae147ae147b,cameraMatrix,distCoeffs,&local_808,&local_810,
                         0x1e00000003);
        cv::Mat::~Mat(rmap[0]);
        pvVar6 = local_bd8;
        dVar10 = local_c00;
        lVar16 = 1;
        pvVar12 = imagePoints + 1;
        bVar35 = false;
      } while (bVar7);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&goodImageList,
                  (value_type *)
                  ((long)&(((local_bd8->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                  (long)local_c00));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&goodImageList,
                  (value_type *)
                  ((long)&(pvVar6->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p +
                  (long)dVar10));
      uVar17 = (uint)local_bb8 + 1;
LAB_0010518a:
      dVar10 = (double)((long)local_bc8 + 1);
    } while (dVar10 != dVar23);
  }
  poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar17);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11," pairs have been successfully detected.\n",0x28);
  if ((int)uVar17 < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error: too little pairs to run the calibration\n",0x2f);
    goto LAB_001071cf;
  }
  uVar31 = (ulong)uVar17;
  std::
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ::resize(imagePoints,uVar31);
  std::
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ::resize(imagePoints + 1,uVar31);
  std::
  vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  ::resize(&objectPoints,uVar31);
  iVar33 = boardSize->height;
  uVar24 = 0;
  do {
    if (0 < iVar33) {
      iVar19 = boardSize->width;
      iVar18 = 0;
      do {
        if (0 < iVar19) {
          iVar33 = 0;
          do {
            rmap[0][0].dims = (int)((float)iVar18 * squareSize);
            rmap[0][0].flags = (int)((float)iVar33 * squareSize);
            rmap[0][0]._8_8_ = rmap[0][0]._8_8_ & 0xffffffff00000000;
            std::vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>>::
            emplace_back<cv::Point3_<float>>
                      ((vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>> *)
                       (objectPoints.
                        super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar24),(Point3_<float> *)rmap);
            iVar33 = iVar33 + 1;
            iVar19 = boardSize->width;
          } while (iVar33 < iVar19);
          iVar33 = boardSize->height;
        }
        iVar18 = iVar18 + 1;
      } while (iVar18 < iVar33);
    }
    uVar24 = uVar24 + 1;
  } while (uVar24 != uVar31);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Running stereo calibration ...\n",0x1f);
  lVar16 = 0;
  do {
    cv::Mat::Mat((Mat *)((long)(&((Mat *)(&((Mat *)(&cameraMatrix[0].step + -3))->step + -3))->step
                               + 0xfffffffffffffffd) + lVar16));
    lVar16 = lVar16 + 0x60;
  } while (lVar16 != 0xc0);
  lVar16 = 0;
  do {
    cv::Mat::Mat((Mat *)((long)(&((Mat *)(&((Mat *)(&distCoeffs[0].step + -3))->step + -3))->step +
                               0xfffffffffffffffd) + lVar16));
    lVar16 = lVar16 + 0x60;
  } while (lVar16 != 0xc0);
  R.data = (uchar *)0x0;
  R.flags = -0x7efbffeb;
  T.data = (uchar *)0x0;
  T.flags = -0x7efbfff3;
  T._8_8_ = imagePoints;
  R._8_8_ = &objectPoints;
  cv::initCameraMatrix2D(rmap);
  cv::Mat::operator=(cameraMatrix,rmap[0]);
  cv::Mat::~Mat(rmap[0]);
  R.data = (uchar *)0x0;
  R.flags = -0x7efbffeb;
  T.data = (uchar *)0x0;
  T.flags = -0x7efbfff3;
  T._8_8_ = imagePoints + 1;
  R._8_8_ = &objectPoints;
  cv::initCameraMatrix2D(rmap,&R);
  cv::Mat::operator=(cameraMatrix + 1,rmap[0]);
  cv::Mat::~Mat(rmap[0]);
  cv::Mat::Mat(&R);
  cv::Mat::Mat(&T);
  cv::Mat::Mat(&E);
  cv::Mat::Mat(&F);
  rmap[0][0].data = (uchar *)0x0;
  rmap[0][0].flags = -0x7efbffeb;
  R1.data = (uchar *)0x0;
  R1.flags = -0x7efbfff3;
  R1._8_8_ = imagePoints;
  R2.data = (uchar *)0x0;
  R2.flags = -0x7efbfff3;
  R2._8_8_ = imagePoints + 1;
  P1.data = (uchar *)0x0;
  P1.flags = 0x3010000;
  P1._8_8_ = cameraMatrix;
  P2.data = (uchar *)0x0;
  P2.flags = 0x3010000;
  P2._8_8_ = distCoeffs;
  Q.data = (uchar *)0x0;
  Q.flags = 0x3010000;
  canvas.data = (uchar *)0x0;
  canvas.flags = 0x3010000;
  canvas_orig.data = (uchar *)0x0;
  img_1.data = (uchar *)0x0;
  rimg.data = (uchar *)0x0;
  rimg.flags = 0x2010000;
  cimg.data = (uchar *)0x0;
  canvas._8_8_ = distCoeffs + 1;
  canvas_orig.flags = 0x2010000;
  img_1.flags = 0x2010000;
  cimg.flags = 0x2010000;
  canvas_orig._8_8_ = &R;
  img_1._8_8_ = &T;
  rmap[0][0]._8_8_ = &objectPoints;
  rimg._8_8_ = &E;
  cimg._8_8_ = &F;
  Q._8_8_ = cameraMatrix + 1;
  dVar23 = (double)cv::stereoCalibrate(rmap,&R1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"done with RMS error=",0x14);
  poVar11 = std::ostream::_M_insert<double>(dVar23);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  lines[1].super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lines[1].super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lines[0].super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lines[1].super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lines[0].super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lines[0].super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_bd8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0;
  uVar24 = 0;
  iVar33 = 0;
  do {
    local_c00 = (double)CONCAT44(local_c00._4_4_,iVar33);
    local_bb8 = uVar24 * 3;
    local_bc8 = (double)((ulong)((long)imagePoints[0].
                                       super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar24].
                                       super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)imagePoints[0].
                                      super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar24].
                                      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3);
    lVar16 = 0;
    local_ba8 = uVar24;
    do {
      cv::Mat::Mat((Mat *)((long)&((Mat *)(&((Mat *)(&rmap[0][0].step + -3))->step + -3))->step +
                          lVar16 + 0xffffffffffffffb8U));
      lVar16 = lVar16 + 0x60;
    } while (lVar16 != 0xc0);
    iVar33 = 1;
    this = rmap[0];
    pvVar15 = lines;
    pMVar27 = distCoeffs;
    pMVar32 = cameraMatrix;
    pvVar12 = imagePoints;
    bVar35 = true;
    do {
      bVar7 = bVar35;
      pvVar21 = (pvVar12->
                super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      R1.flags = 0x42ff400d;
      R1.dims = 2;
      uVar24 = *(long *)((long)&(pvVar21->
                                super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                )._M_impl.super__Vector_impl_data + local_bb8 * 8 + 8) -
               *(long *)((long)&(pvVar21->
                                super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                )._M_impl.super__Vector_impl_data + local_bb8 * 8);
      R1.cols = 1;
      R1.rows = (int)(uVar24 >> 3);
      R1.allocator = (MatAllocator *)0x0;
      R1.u = (UMatData *)0x0;
      R1.datalimit = (uchar *)0x0;
      R1.datastart = (uchar *)0x0;
      R1.size.p = &R1.rows;
      R1.step.p = R1.step.buf;
      R1.step.buf[0] = 0;
      R1.step.buf[1] = 0;
      puVar1 = *(uchar **)
                ((long)&(pvVar21->
                        super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>).
                        _M_impl.super__Vector_impl_data + local_bb8 * 8);
      if (puVar1 != *(uchar **)
                     ((long)&(pvVar21->
                             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                             )._M_impl.super__Vector_impl_data + local_bb8 * 8 + 8)) {
        R1.step.buf[1] = 8;
        R1.step.buf[0] = 8;
        R1.datalimit = puVar1 + ((long)(uVar24 * 0x20000000) >> 0x1d & 0xfffffffffffffff8);
        R1.datastart = puVar1;
      }
      R1.data = R1.datastart;
      R1.dataend = R1.datalimit;
      cv::Mat::operator=(this,&R1);
      cv::Mat::~Mat(&R1);
      R2.data = (uchar *)0x0;
      R2.flags = 0x1010000;
      P1.data = (uchar *)0x0;
      P1.flags = 0x2010000;
      P2.data = (uchar *)0x0;
      P2.flags = 0x1010000;
      Q.data = (uchar *)0x0;
      Q.flags = 0x1010000;
      P1._8_8_ = this;
      R2._8_8_ = this;
      P2._8_8_ = pMVar32;
      Q._8_8_ = pMVar27;
      cv::Mat::Mat(&R1);
      canvas.data = (uchar *)0x0;
      canvas.flags = 0x1010000;
      canvas_orig.data = (uchar *)0x0;
      canvas_orig.flags = 0x1010000;
      canvas._8_8_ = &R1;
      canvas_orig._8_8_ = pMVar32;
      cv::undistortPoints((_InputArray *)&R2,(_OutputArray *)&P1,(_InputArray *)&P2,
                          (_InputArray *)&Q,(_InputArray *)&canvas,(_InputArray *)&canvas_orig);
      cv::Mat::~Mat(&R1);
      R1.data = (uchar *)0x0;
      R1.flags = 0x1010000;
      R2.data = (uchar *)0x0;
      R2.flags = 0x1010000;
      R2._8_8_ = &F;
      P1.data = (uchar *)0x0;
      P1.flags = -0x7dfcffeb;
      R1._8_8_ = this;
      P1._8_8_ = pvVar15;
      cv::computeCorrespondEpilines
                ((_InputArray *)&R1,iVar33,(_InputArray *)&R2,(_OutputArray *)&P1);
      uVar24 = local_ba8;
      iVar33 = 2;
      this = rmap[0] + 1;
      pvVar15 = lines + 1;
      pMVar27 = distCoeffs + 1;
      pMVar32 = cameraMatrix + 1;
      pvVar12 = imagePoints + 1;
      bVar35 = false;
    } while (bVar7);
    if (0 < (int)SUB84(local_bc8,0)) {
      pPVar2 = imagePoints[0].
               super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_ba8].
               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      pPVar3 = imagePoints[1].
               super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_ba8].
               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar16 = 8;
      uVar22 = 0;
      do {
        local_bd8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((double)local_bd8 +
                       (double)(ABS(*(float *)(lines[0].
                                               super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start + lVar16) +
                                    *(float *)(lines[0].
                                               super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start +
                                              lVar16 + -4) * pPVar3[uVar22].y +
                                    *(float *)(lines[0].
                                               super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start +
                                              lVar16 + -8) * pPVar3[uVar22].x) +
                               ABS(*(float *)(lines[1].
                                              super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + lVar16) +
                                   *(float *)(lines[1].
                                              super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start +
                                             lVar16 + -4) * pPVar2[uVar22].y +
                                   *(float *)(lines[1].
                                              super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start +
                                             lVar16 + -8) * pPVar2[uVar22].x)));
        uVar22 = uVar22 + 1;
        lVar16 = lVar16 + 0xc;
      } while ((SUB84(local_bc8,0) & 0x7fffffff) != uVar22);
    }
    lVar16 = 0x60;
    do {
      cv::Mat::~Mat((Mat *)((long)&((Mat *)(&((Mat *)(&rmap[0][0].step + -3))->step + -3))->step +
                           lVar16 + 0xffffffffffffffb8U));
      lVar16 = lVar16 + -0x60;
    } while (lVar16 != -0x60);
    iVar33 = local_c00._0_4_ + local_bc8._0_4_;
    uVar24 = uVar24 + 1;
  } while (uVar24 != uVar31);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"average epipolar err = ",0x17);
  poVar11 = std::ostream::_M_insert<double>((double)local_bd8 / (double)iVar33);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  ppuVar29 = &rmap[0][0].data;
  rmap[0][0]._0_8_ = ppuVar29;
  std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"intrinsics.yml","");
  R1.rows = 0;
  R1.cols = 0;
  R1.data = (uchar *)((ulong)R1.data & 0xffffffffffffff00);
  R1._0_8_ = &R1.data;
  cv::FileStorage::FileStorage(&fs,(string *)rmap,1,(string *)&R1);
  if ((uchar **)R1._0_8_ != &R1.data) {
    operator_delete((void *)R1._0_8_);
  }
  if ((uchar **)rmap[0][0]._0_8_ != ppuVar29) {
    operator_delete((void *)rmap[0][0]._0_8_);
  }
  cVar8 = cv::FileStorage::isOpened();
  if (cVar8 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error: can not save the intrinsic parameters\n",0x2d);
LAB_00105e56:
    cv::Mat::Mat(&R1);
    cv::Mat::Mat(&R2);
    cv::Mat::Mat(&P1);
    cv::Mat::Mat(&P2);
    cv::Mat::Mat(&Q);
    validRoi[1].x = 0;
    validRoi[1].y = 0;
    validRoi[1].width = 0;
    validRoi[1].height = 0;
    validRoi[0].x = 0;
    validRoi[0].y = 0;
    validRoi[0].width = 0;
    validRoi[0].height = 0;
    rmap[0][0].data = (uchar *)0x0;
    rmap[0][0].flags = 0x1010000;
    rmap[0][0]._8_8_ = cameraMatrix;
    canvas.data = (uchar *)0x0;
    canvas.flags = 0x1010000;
    canvas._8_8_ = distCoeffs;
    canvas_orig.data = (uchar *)0x0;
    canvas_orig.flags = 0x1010000;
    canvas_orig._8_8_ = cameraMatrix + 1;
    img_1.data = (uchar *)0x0;
    img_1.flags = 0x1010000;
    img_1._8_8_ = distCoeffs + 1;
    rimg.data = (uchar *)0x0;
    rimg.flags = 0x1010000;
    rimg._8_8_ = &R;
    cimg.data = (uchar *)0x0;
    cimg.flags = 0x1010000;
    cimg._8_8_ = &T;
    gimg.data = (uchar *)0x0;
    canvasPart.data = (uchar *)0x0;
    canvasPart_orig.data = (uchar *)0x0;
    local_bf8.super__InputArray.sz.width = 0;
    local_bf8.super__InputArray.sz.height = 0;
    local_c18.sz.width = 0;
    local_c18.sz.height = 0;
    gimg.flags = 0x2010000;
    canvasPart.flags = 0x2010000;
    canvasPart_orig.flags = 0x2010000;
    local_bf8.super__InputArray.flags = 0x2010000;
    local_c18.flags = 0x2010000;
    gimg._8_8_ = &R1;
    canvasPart._8_8_ = &R2;
    local_bf8.super__InputArray.obj = &P2;
    local_c18.obj = &Q;
    canvasPart_orig._8_8_ = &P1;
    cv::stereoRectify(0x3ff0000000000000);
    ppuVar29 = &rmap[0][0].data;
    rmap[0][0]._0_8_ = ppuVar29;
    std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"extrinsics.yml","");
    canvas.rows = 0;
    canvas.cols = 0;
    canvas.data = (uchar *)((ulong)canvas.data & 0xffffffffffffff00);
    canvas._0_8_ = &canvas.data;
    cv::FileStorage::open((string *)&fs,(int)rmap,(string *)0x1);
    if ((uchar **)canvas._0_8_ != &canvas.data) {
      operator_delete((void *)canvas._0_8_);
    }
    if ((uchar **)rmap[0][0]._0_8_ != ppuVar29) {
      operator_delete((void *)rmap[0][0]._0_8_);
    }
    cVar8 = cv::FileStorage::isOpened();
    if (cVar8 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error: can not save the extrinsic parameters\n",0x2d);
    }
    else {
      rmap[0][0]._0_8_ = ppuVar29;
      std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"R","");
      pFVar13 = (FileStorage *)cv::operator<<(&fs,(string *)rmap);
      if ((uchar **)rmap[0][0]._0_8_ != ppuVar29) {
        operator_delete((void *)rmap[0][0]._0_8_);
      }
      cVar8 = (**(code **)(*(long *)pFVar13 + 0x18))(pFVar13);
      if (cVar8 != '\0') {
        if (*(int *)(pFVar13 + 8) == 6) goto LAB_0010732a;
        cv::write(pFVar13,(string *)(pFVar13 + 0x10),&R);
        if (((byte)pFVar13[8] & 4) != 0) {
          *(undefined4 *)(pFVar13 + 8) = 6;
        }
      }
      rmap[0][0]._0_8_ = ppuVar29;
      std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"T","");
      pFVar13 = (FileStorage *)cv::operator<<(pFVar13,(string *)rmap);
      if ((uchar **)rmap[0][0]._0_8_ != ppuVar29) {
        operator_delete((void *)rmap[0][0]._0_8_);
      }
      cVar8 = (**(code **)(*(long *)pFVar13 + 0x18))(pFVar13);
      if (cVar8 != '\0') {
        if (*(int *)(pFVar13 + 8) == 6) goto LAB_0010736e;
        cv::write(pFVar13,(string *)(pFVar13 + 0x10),&T);
        if (((byte)pFVar13[8] & 4) != 0) {
          *(undefined4 *)(pFVar13 + 8) = 6;
        }
      }
      rmap[0][0]._0_8_ = ppuVar29;
      std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"R1","");
      pFVar13 = (FileStorage *)cv::operator<<(pFVar13,(string *)rmap);
      if ((uchar **)rmap[0][0]._0_8_ != ppuVar29) {
        operator_delete((void *)rmap[0][0]._0_8_);
      }
      cVar8 = (**(code **)(*(long *)pFVar13 + 0x18))(pFVar13);
      if (cVar8 != '\0') {
        if (*(int *)(pFVar13 + 8) == 6) goto LAB_001073b2;
        cv::write(pFVar13,(string *)(pFVar13 + 0x10),&R1);
        if (((byte)pFVar13[8] & 4) != 0) {
          *(undefined4 *)(pFVar13 + 8) = 6;
        }
      }
      rmap[0][0]._0_8_ = ppuVar29;
      std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"R2","");
      pFVar13 = (FileStorage *)cv::operator<<(pFVar13,(string *)rmap);
      if ((uchar **)rmap[0][0]._0_8_ != ppuVar29) {
        operator_delete((void *)rmap[0][0]._0_8_);
      }
      cVar8 = (**(code **)(*(long *)pFVar13 + 0x18))(pFVar13);
      if (cVar8 != '\0') {
        if (*(int *)(pFVar13 + 8) == 6) goto LAB_001073f6;
        cv::write(pFVar13,(string *)(pFVar13 + 0x10),&R2);
        if (((byte)pFVar13[8] & 4) != 0) {
          *(undefined4 *)(pFVar13 + 8) = 6;
        }
      }
      rmap[0][0]._0_8_ = ppuVar29;
      std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"P1","");
      pFVar13 = (FileStorage *)cv::operator<<(pFVar13,(string *)rmap);
      if ((uchar **)rmap[0][0]._0_8_ != ppuVar29) {
        operator_delete((void *)rmap[0][0]._0_8_);
      }
      cVar8 = (**(code **)(*(long *)pFVar13 + 0x18))(pFVar13);
      if (cVar8 != '\0') {
        if (*(int *)(pFVar13 + 8) == 6) goto LAB_0010743a;
        cv::write(pFVar13,(string *)(pFVar13 + 0x10),&P1);
        if (((byte)pFVar13[8] & 4) != 0) {
          *(undefined4 *)(pFVar13 + 8) = 6;
        }
      }
      rmap[0][0]._0_8_ = ppuVar29;
      std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"P2","");
      pFVar13 = (FileStorage *)cv::operator<<(pFVar13,(string *)rmap);
      if ((uchar **)rmap[0][0]._0_8_ != ppuVar29) {
        operator_delete((void *)rmap[0][0]._0_8_);
      }
      cVar8 = (**(code **)(*(long *)pFVar13 + 0x18))(pFVar13);
      if (cVar8 != '\0') {
        if (*(int *)(pFVar13 + 8) == 6) goto LAB_0010747e;
        cv::write(pFVar13,(string *)(pFVar13 + 0x10),&P2);
        if (((byte)pFVar13[8] & 4) != 0) {
          *(undefined4 *)(pFVar13 + 8) = 6;
        }
      }
      rmap[0][0]._0_8_ = ppuVar29;
      std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"Q","");
      pFVar13 = (FileStorage *)cv::operator<<(pFVar13,(string *)rmap);
      if ((uchar **)rmap[0][0]._0_8_ != ppuVar29) {
        operator_delete((void *)rmap[0][0]._0_8_);
      }
      cVar8 = (**(code **)(*(long *)pFVar13 + 0x18))(pFVar13);
      if (cVar8 != '\0') {
        if (*(int *)(pFVar13 + 8) == 6) goto LAB_001074c2;
        cv::write(pFVar13,(string *)(pFVar13 + 0x10),&Q);
        if (((byte)pFVar13[8] & 4) != 0) {
          *(undefined4 *)(pFVar13 + 8) = 6;
        }
      }
      cv::FileStorage::release();
    }
    if ((char)local_b9c != '\0') {
      local_bc8 = ABS(*(double *)(P2.data + *P2.step.p + 0x18));
      uStack_bc0 = 0;
      local_bd8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(*(ulong *)(P2.data + 0x18) & 0x7fffffffffffffff);
      uStack_bd0 = 0;
      lVar16 = 0;
      do {
        cv::Mat::Mat((Mat *)((long)&((Mat *)(&((Mat *)(&rmap[0][0].step + -3))->step + -3))->step +
                            lVar16 + 0xffffffffffffffb8U));
        lVar16 = lVar16 + 0x60;
      } while (lVar16 != 0x180);
      canvas.data = (uchar *)0x0;
      canvas.flags = 0x1010000;
      canvas._8_8_ = cameraMatrix;
      canvas_orig.data = (uchar *)0x0;
      canvas_orig.flags = 0x1010000;
      canvas_orig._8_8_ = distCoeffs;
      img_1.data = (uchar *)0x0;
      img_1.flags = 0x1010000;
      img_1._8_8_ = &R1;
      rimg.data = (uchar *)0x0;
      rimg.flags = 0x1010000;
      rimg._8_8_ = &P1;
      cimg.data = (uchar *)0x0;
      cimg.flags = 0x2010000;
      cimg._8_8_ = rmap;
      gimg._8_8_ = rmap[0] + 1;
      gimg.data = (uchar *)0x0;
      gimg.flags = 0x2010000;
      cv::initUndistortRectifyMap();
      canvas.data = (uchar *)0x0;
      canvas.flags = 0x1010000;
      canvas._8_8_ = cameraMatrix + 1;
      canvas_orig.data = (uchar *)0x0;
      canvas_orig.flags = 0x1010000;
      canvas_orig._8_8_ = distCoeffs + 1;
      img_1.data = (uchar *)0x0;
      img_1.flags = 0x1010000;
      img_1._8_8_ = &R2;
      rimg.data = (uchar *)0x0;
      rimg.flags = 0x1010000;
      rimg._8_8_ = &P2;
      cimg._8_8_ = rmap + 1;
      cimg.data = (uchar *)0x0;
      cimg.flags = 0x2010000;
      gimg._8_8_ = rmap[1] + 1;
      gimg.data = (uchar *)0x0;
      gimg.flags = 0x2010000;
      cv::initUndistortRectifyMap();
      cv::Mat::Mat(&canvas);
      cv::Mat::Mat(&canvas_orig);
      iVar33 = iVar34;
      if (iVar34 < iVar30) {
        iVar33 = iVar30;
      }
      if (local_bc8 <= (double)local_bd8) {
        local_c00 = 600.0 / (double)iVar33;
        iVar30 = (int)ROUND((double)iVar30 * local_c00);
        iVar34 = (int)ROUND((double)iVar34 * local_c00);
        cv::Mat::create((int)&canvas,iVar34,iVar30 * 2);
        cv::Mat::create((int)&canvas_orig,iVar34,iVar30 * 2);
      }
      else {
        local_c00 = 300.0 / (double)iVar33;
        iVar30 = (int)ROUND((double)iVar30 * local_c00);
        iVar34 = (int)ROUND((double)iVar34 * local_c00);
        cv::Mat::create((int)&canvas,iVar34 * 2,iVar30);
        cv::Mat::create((int)&canvas_orig,iVar34 * 2,iVar30);
      }
      local_bb8 = 0;
      uStack_bb0._0_4_ = 0;
      uStack_bb0._4_4_ = 0x406fe000;
      uVar24 = 0;
      do {
        paMVar28 = rmap;
        pRVar25 = validRoi;
        iVar33 = 0;
        local_ba8 = uVar24;
        bVar35 = true;
        do {
          bVar7 = bVar35;
          cv::imread((string *)&img_1,
                     iVar33 * 0x20 +
                     (int)goodImageList.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (int)(uVar24 << 6));
          cv::Mat::Mat(&rimg);
          cv::Mat::Mat(&cimg);
          cv::Mat::Mat(&gimg);
          canvasPart_orig.data = (uchar *)0x0;
          canvasPart_orig.flags = 0x1010000;
          local_bf8.super__InputArray.sz.width = 0;
          local_bf8.super__InputArray.sz.height = 0;
          local_bf8.super__InputArray.flags = 0x2010000;
          local_bf8.super__InputArray.obj = &rimg;
          local_c18.sz.width = 0;
          local_c18.sz.height = 0;
          local_c18.flags = 0x1010000;
          local_5a0.obj = *paMVar28 + 1;
          local_5a0.sz.width = 0;
          local_5a0.sz.height = 0;
          local_5a0.flags = 0x1010000;
          canvasPart.data = (uchar *)0x0;
          canvasPart.datastart = (uchar *)0x0;
          canvasPart.flags = 0;
          canvasPart.dims = 0;
          canvasPart.rows = 0;
          canvasPart.cols = 0;
          iVar19 = 1;
          local_c18.obj = paMVar28;
          canvasPart_orig._8_8_ = &img_1;
          cv::remap((_InputArray *)&canvasPart_orig,&local_bf8,&local_c18,&local_5a0,1,0,
                    (Scalar_ *)&canvasPart);
          canvasPart.data = (uchar *)0x0;
          canvasPart.flags = 0x1010000;
          canvasPart_orig.data = (uchar *)0x0;
          canvasPart_orig.flags = 0x2010000;
          canvasPart_orig._8_8_ = &cimg;
          canvasPart._8_8_ = &rimg;
          cv::cvtColor((cv *)&canvasPart,(_InputArray *)&canvasPart_orig,(_OutputArray *)0x8,0,
                       iVar19);
          canvasPart.data = (uchar *)0x0;
          canvasPart.flags = 0x1010000;
          canvasPart._8_8_ = &img_1;
          canvasPart_orig.data = (uchar *)0x0;
          canvasPart_orig.flags = 0x2010000;
          canvasPart_orig._8_8_ = &gimg;
          cv::cvtColor((cv *)&canvasPart,(_InputArray *)&canvasPart_orig,(_OutputArray *)0x8,0,
                       iVar19);
          if (local_bc8 <= (double)local_bd8) {
            canvasPart_orig.dims = 0;
            canvasPart_orig.cols = iVar34;
            canvasPart_orig.rows = iVar30;
            canvasPart_orig.flags = iVar33 * iVar30;
            cv::Mat::Mat(&canvasPart,&canvas,(Rect_ *)&canvasPart_orig);
            local_bf8.super__InputArray._4_4_ = 0;
            local_bf8.super__InputArray.flags = iVar33 * iVar30;
            local_bf8.super__InputArray.obj._0_4_ = iVar30;
            local_bf8.super__InputArray.obj._4_4_ = iVar34;
            cv::Mat::Mat(&canvasPart_orig,&canvas_orig,(Rect_ *)&local_bf8);
          }
          else {
            auVar5._4_4_ = iVar30;
            auVar5._0_4_ = iVar33 * iVar34;
            auVar5._8_4_ = iVar34;
            auVar5._12_4_ = 0;
            local_bf8.super__InputArray._0_16_ = auVar5 << 0x20;
            cv::Mat::Mat(&canvasPart,&canvas,(Rect_ *)&local_bf8);
            local_c18.flags = 0;
            local_c18.obj = (void *)CONCAT44(iVar34,iVar30);
            local_c18._4_4_ = iVar33 * iVar34;
            cv::Mat::Mat(&canvasPart_orig,&canvas_orig,(Rect_ *)&local_c18);
          }
          local_bf8.super__InputArray.sz.width = 0;
          local_bf8.super__InputArray.sz.height = 0;
          local_bf8.super__InputArray.flags = 0x1010000;
          local_bf8.super__InputArray.obj = &cimg;
          local_c18.sz.width = 0;
          local_c18.sz.height = 0;
          local_c18.flags = 0x2010000;
          local_820 = CONCAT44((int)*(undefined8 *)canvasPart.size.p,
                               (int)((ulong)*(undefined8 *)canvasPart.size.p >> 0x20));
          local_c18.obj = &canvasPart;
          cv::resize(0,0,&local_bf8,&local_c18,&local_820,3);
          local_bf8.super__InputArray.sz.width = 0;
          local_bf8.super__InputArray.sz.height = 0;
          local_bf8.super__InputArray.flags = 0x1010000;
          local_c18.sz.width = 0;
          local_c18.sz.height = 0;
          local_c18.flags = 0x2010000;
          local_828 = CONCAT44((int)*(undefined8 *)canvasPart_orig.size.p,
                               (int)((ulong)*(undefined8 *)canvasPart_orig.size.p >> 0x20));
          local_c18.obj = &canvasPart_orig;
          local_bf8.super__InputArray.obj = &gimg;
          cv::resize(0,0,&local_bf8,&local_c18,&local_828,3);
          iVar19 = (int)ROUND((double)pRVar25->x * local_c00);
          iVar26 = (int)ROUND((double)pRVar25->y * local_c00);
          iVar33 = (int)ROUND((double)pRVar25->width * local_c00);
          iVar18 = (int)ROUND((double)pRVar25->height * local_c00);
          local_c18.sz.width = 0;
          local_c18.sz.height = 0;
          local_c18.flags = 0x3010000;
          local_c18.obj = &canvasPart;
          local_bf8.super__InputArray._0_16_ = ZEXT816(0);
          local_bf8.super__InputArray.sz.width = 0;
          local_bf8.super__InputArray.sz.height = 0x406fe000;
          uStack_be0 = 0;
          local_938 = iVar19;
          local_934 = iVar26;
          local_930 = iVar33;
          local_92c = iVar18;
          cv::rectangle(&local_c18,&local_938,&local_bf8,3,8);
          local_c18.sz.width = 0;
          local_c18.sz.height = 0;
          local_c18.flags = 0x3010000;
          local_bf8.super__InputArray.flags = 0;
          local_bf8.super__InputArray._4_4_ = 0;
          local_bf8.super__InputArray.obj = (void *)0x0;
          local_bf8.super__InputArray.sz.width = 0;
          local_bf8.super__InputArray.sz.height = 0x406fe000;
          uStack_be0 = 0;
          local_c18.obj = &canvasPart_orig;
          local_948 = iVar19;
          local_944 = iVar26;
          local_940 = iVar33;
          local_93c = iVar18;
          cv::rectangle(&local_c18,&local_948,&local_bf8,3,8);
          cv::Mat::~Mat(&canvasPart_orig);
          cv::Mat::~Mat(&canvasPart);
          cv::Mat::~Mat(&gimg);
          cv::Mat::~Mat(&cimg);
          cv::Mat::~Mat(&rimg);
          cv::Mat::~Mat(&img_1);
          iVar33 = 1;
          paMVar28 = rmap + 1;
          pRVar25 = validRoi + 1;
          bVar35 = false;
        } while (bVar7);
        if (local_bc8 <= (double)local_bd8) {
          if (0 < canvas.rows) {
            iVar33 = 0;
            do {
              rimg.data = (uchar *)0x0;
              rimg.flags = 0x3010000;
              rimg._8_8_ = &canvas;
              local_b60 = 0;
              local_b68 = canvas.cols;
              img_1.flags = (uint)local_bb8;
              img_1.dims = local_bb8._4_4_;
              img_1.rows = (int)uStack_bb0;
              img_1.cols = uStack_bb0._4_4_;
              img_1.data = (uchar *)0x0;
              img_1.datastart = (uchar *)0x0;
              local_b64 = iVar33;
              local_b5c = iVar33;
              cv::line(&rimg,&local_b60,&local_b68,&img_1,1,8,0);
              rimg.data = (uchar *)0x0;
              rimg.flags = 0x3010000;
              rimg._8_8_ = &canvas_orig;
              local_b70 = 0;
              local_b80[2] = canvas_orig.cols;
              img_1.flags = (uint)local_bb8;
              img_1.dims = local_bb8._4_4_;
              img_1.rows = (int)uStack_bb0;
              img_1.cols = uStack_bb0._4_4_;
              img_1.data = (uchar *)0x0;
              img_1.datastart = (uchar *)0x0;
              local_b74 = iVar33;
              local_b6c = iVar33;
              cv::line(&rimg,&local_b70,local_b80 + 2,&img_1,1,8,0);
              iVar33 = iVar33 + 0x10;
            } while (iVar33 < canvas.rows);
          }
        }
        else if (0 < canvas.cols) {
          iVar33 = 0;
          do {
            rimg.data = (uchar *)0x0;
            rimg.flags = 0x3010000;
            rimg._8_8_ = &canvas;
            local_b80[1] = 0;
            local_b84 = canvas.rows;
            img_1.flags = (uint)local_bb8;
            img_1.dims = local_bb8._4_4_;
            img_1.rows = (int)uStack_bb0;
            img_1.cols = uStack_bb0._4_4_;
            img_1.data = (uchar *)0x0;
            img_1.datastart = (uchar *)0x0;
            local_b90[2] = iVar33;
            local_b80[0] = iVar33;
            cv::line(&rimg,local_b80,local_b90 + 2,&img_1,1,8,0);
            rimg.data = (uchar *)0x0;
            rimg.flags = 0x3010000;
            rimg._8_8_ = &canvas_orig;
            local_b90[1] = 0;
            local_b94 = canvas_orig.rows;
            img_1.flags = (uint)local_bb8;
            img_1.dims = local_bb8._4_4_;
            img_1.rows = (int)uStack_bb0;
            img_1.cols = uStack_bb0._4_4_;
            img_1.data = (uchar *)0x0;
            img_1.datastart = (uchar *)0x0;
            local_b98 = iVar33;
            local_b90[0] = iVar33;
            cv::line(&rimg,local_b90,&local_b98,&img_1,1,8,0);
            iVar33 = iVar33 + 0x10;
          } while (iVar33 < canvas.cols);
        }
        ppuVar29 = &img_1.data;
        img_1._0_8_ = ppuVar29;
        std::__cxx11::string::_M_construct<char_const*>((string *)&img_1,"rectified","");
        rimg.data = (uchar *)0x0;
        rimg.flags = 0x1010000;
        rimg._8_8_ = &canvas;
        cv::imshow((string *)&img_1,(_InputArray *)&rimg);
        if ((uchar **)img_1._0_8_ != ppuVar29) {
          operator_delete((void *)img_1._0_8_);
        }
        img_1._0_8_ = ppuVar29;
        std::__cxx11::string::_M_construct<char_const*>((string *)&img_1,"unrectified","");
        rimg.data = (uchar *)0x0;
        rimg.flags = 0x1010000;
        rimg._8_8_ = &canvas_orig;
        cv::imshow((string *)&img_1,(_InputArray *)&rimg);
        if ((uchar **)img_1._0_8_ != ppuVar29) {
          operator_delete((void *)img_1._0_8_);
        }
        bVar9 = cv::waitKey(0);
      } while (((bVar9 != 0x1b) && ((bVar9 & 0xdf) != 0x51)) &&
              (uVar24 = local_ba8 + 1, uVar24 != uVar31));
      cv::Mat::~Mat(&canvas_orig);
      cv::Mat::~Mat(&canvas);
      lVar16 = 0x120;
      do {
        cv::Mat::~Mat((Mat *)((long)&((Mat *)(&((Mat *)(&rmap[0][0].step + -3))->step + -3))->step +
                             lVar16 + 0xffffffffffffffb8U));
        lVar16 = lVar16 + -0x60;
      } while (lVar16 != -0x60);
    }
    cv::Mat::~Mat(&Q);
    cv::Mat::~Mat(&P2);
    cv::Mat::~Mat(&P1);
    cv::Mat::~Mat(&R2);
    cv::Mat::~Mat(&R1);
    cv::FileStorage::~FileStorage(&fs);
    lVar16 = 0x18;
    do {
      pvVar4 = *(void **)((long)&lines[0].
                                 super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar16);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4);
      }
      lVar16 = lVar16 + -0x18;
    } while (lVar16 != -0x18);
    cv::Mat::~Mat(&F);
    cv::Mat::~Mat(&E);
    cv::Mat::~Mat(&T);
    cv::Mat::~Mat(&R);
    lVar16 = 0x60;
    do {
      cv::Mat::~Mat((Mat *)((long)(&((Mat *)(&((Mat *)(&distCoeffs[0].step + -3))->step + -3))->step
                                  + 0xfffffffffffffffd) + lVar16));
      lVar16 = lVar16 + -0x60;
    } while (lVar16 != -0x60);
    lVar16 = 0x60;
    do {
      cv::Mat::~Mat((Mat *)((long)(&((Mat *)(&((Mat *)(&cameraMatrix[0].step + -3))->step + -3))->
                                    step + 0xfffffffffffffffd) + lVar16));
      lVar16 = lVar16 + -0x60;
    } while (lVar16 != -0x60);
LAB_001071cf:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&goodImageList);
    std::
    vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
    ::~vector(&objectPoints);
    lVar16 = 0x18;
    do {
      std::
      vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
      ::~vector((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                 *)((long)&imagePoints[0].
                           super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar16));
      lVar16 = lVar16 + -0x18;
    } while (lVar16 != -0x18);
    return;
  }
  rmap[0][0]._0_8_ = ppuVar29;
  std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"M1","");
  pFVar13 = (FileStorage *)cv::operator<<(&fs,(string *)rmap);
  if ((uchar **)rmap[0][0]._0_8_ != ppuVar29) {
    operator_delete((void *)rmap[0][0]._0_8_);
  }
  cVar8 = (**(code **)(*(long *)pFVar13 + 0x18))(pFVar13);
  if (cVar8 == '\0') {
LAB_00105cb5:
    rmap[0][0]._0_8_ = ppuVar29;
    std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"D1","");
    pFVar13 = (FileStorage *)cv::operator<<(pFVar13,(string *)rmap);
    if ((uchar **)rmap[0][0]._0_8_ != ppuVar29) {
      operator_delete((void *)rmap[0][0]._0_8_);
    }
    cVar8 = (**(code **)(*(long *)pFVar13 + 0x18))(pFVar13);
    if (cVar8 != '\0') {
      if (*(int *)(pFVar13 + 8) == 6) goto LAB_0010725e;
      cv::write(pFVar13,(string *)(pFVar13 + 0x10),distCoeffs);
      if (((byte)pFVar13[8] & 4) != 0) {
        *(undefined4 *)(pFVar13 + 8) = 6;
      }
    }
    rmap[0][0]._0_8_ = ppuVar29;
    std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"M2","");
    pFVar13 = (FileStorage *)cv::operator<<(pFVar13,(string *)rmap);
    if ((uchar **)rmap[0][0]._0_8_ != ppuVar29) {
      operator_delete((void *)rmap[0][0]._0_8_);
    }
    cVar8 = (**(code **)(*(long *)pFVar13 + 0x18))(pFVar13);
    if (cVar8 != '\0') {
      if (*(int *)(pFVar13 + 8) == 6) goto LAB_001072a2;
      cv::write(pFVar13,(string *)(pFVar13 + 0x10),cameraMatrix + 1);
      if (((byte)pFVar13[8] & 4) != 0) {
        *(undefined4 *)(pFVar13 + 8) = 6;
      }
    }
    rmap[0][0]._0_8_ = ppuVar29;
    std::__cxx11::string::_M_construct<char_const*>((string *)rmap,"D2","");
    pFVar13 = (FileStorage *)cv::operator<<(pFVar13,(string *)rmap);
    if ((uchar **)rmap[0][0]._0_8_ != ppuVar29) {
      operator_delete((void *)rmap[0][0]._0_8_);
    }
    cVar8 = (**(code **)(*(long *)pFVar13 + 0x18))(pFVar13);
    if (cVar8 != '\0') {
      if (*(int *)(pFVar13 + 8) == 6) goto LAB_001072e6;
      cv::write(pFVar13,(string *)(pFVar13 + 0x10),distCoeffs + 1);
      if (((byte)pFVar13[8] & 4) != 0) {
        *(undefined4 *)(pFVar13 + 8) = 6;
      }
    }
    cv::FileStorage::release();
    goto LAB_00105e56;
  }
  if (*(int *)(pFVar13 + 8) != 6) {
    cv::write(pFVar13,(string *)(pFVar13 + 0x10),cameraMatrix);
    if (((byte)pFVar13[8] & 4) != 0) {
      *(undefined4 *)(pFVar13 + 8) = 6;
    }
    goto LAB_00105cb5;
  }
  rmap[0][0]._0_8_ = ppuVar29;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)rmap,"No element name has been given","");
  cv::error(-2,(string *)rmap,"operator<<","/usr/include/opencv4/opencv2/core/persistence.hpp",0x4c8
           );
LAB_0010725e:
  rmap[0][0]._0_8_ = ppuVar29;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)rmap,"No element name has been given","");
  cv::error(-2,(string *)rmap,"operator<<","/usr/include/opencv4/opencv2/core/persistence.hpp",0x4c8
           );
LAB_001072a2:
  rmap[0][0]._0_8_ = ppuVar29;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)rmap,"No element name has been given","");
  cv::error(-2,(string *)rmap,"operator<<","/usr/include/opencv4/opencv2/core/persistence.hpp",0x4c8
           );
LAB_001072e6:
  rmap[0][0]._0_8_ = ppuVar29;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)rmap,"No element name has been given","");
  cv::error(-2,(string *)rmap,"operator<<","/usr/include/opencv4/opencv2/core/persistence.hpp",0x4c8
           );
LAB_0010732a:
  rmap[0][0]._0_8_ = &rmap[0][0].data;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)rmap,"No element name has been given","");
  cv::error(-2,(string *)rmap,"operator<<","/usr/include/opencv4/opencv2/core/persistence.hpp",0x4c8
           );
LAB_0010736e:
  rmap[0][0]._0_8_ = &rmap[0][0].data;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)rmap,"No element name has been given","");
  cv::error(-2,(string *)rmap,"operator<<","/usr/include/opencv4/opencv2/core/persistence.hpp",0x4c8
           );
LAB_001073b2:
  rmap[0][0]._0_8_ = &rmap[0][0].data;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)rmap,"No element name has been given","");
  cv::error(-2,(string *)rmap,"operator<<","/usr/include/opencv4/opencv2/core/persistence.hpp",0x4c8
           );
LAB_001073f6:
  rmap[0][0]._0_8_ = &rmap[0][0].data;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)rmap,"No element name has been given","");
  cv::error(-2,(string *)rmap,"operator<<","/usr/include/opencv4/opencv2/core/persistence.hpp",0x4c8
           );
LAB_0010743a:
  rmap[0][0]._0_8_ = &rmap[0][0].data;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)rmap,"No element name has been given","");
  cv::error(-2,(string *)rmap,"operator<<","/usr/include/opencv4/opencv2/core/persistence.hpp",0x4c8
           );
LAB_0010747e:
  rmap[0][0]._0_8_ = &rmap[0][0].data;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)rmap,"No element name has been given","");
  cv::error(-2,(string *)rmap,"operator<<","/usr/include/opencv4/opencv2/core/persistence.hpp",0x4c8
           );
LAB_001074c2:
  rmap[0][0]._0_8_ = &rmap[0][0].data;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)rmap,"No element name has been given","");
  uVar14 = cv::error(-2,(string *)rmap,"operator<<",
                     "/usr/include/opencv4/opencv2/core/persistence.hpp",0x4c8);
  if ((uchar **)rmap[0][0]._0_8_ != &rmap[0][0].data) {
    operator_delete((void *)rmap[0][0]._0_8_);
  }
  cv::Mat::~Mat(&Q);
  cv::Mat::~Mat(&P2);
  cv::Mat::~Mat(&P1);
  cv::Mat::~Mat(&R2);
  cv::Mat::~Mat(&R1);
  cv::FileStorage::~FileStorage(&fs);
  lVar16 = 0x18;
  do {
    pvVar4 = *(void **)((long)&lines[0].
                               super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar16);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4);
    }
    lVar16 = lVar16 + -0x18;
  } while (lVar16 != -0x18);
  cv::Mat::~Mat(&F);
  cv::Mat::~Mat(&E);
  cv::Mat::~Mat(&T);
  cv::Mat::~Mat(&R);
  lVar16 = 0x60;
  do {
    cv::Mat::~Mat((Mat *)((long)(&((Mat *)(&((Mat *)(&distCoeffs[0].step + -3))->step + -3))->step +
                                0xfffffffffffffffd) + lVar16));
    lVar16 = lVar16 + -0x60;
  } while (lVar16 != -0x60);
  lVar16 = 0x60;
  do {
    cv::Mat::~Mat((Mat *)((long)(&((Mat *)(&((Mat *)(&cameraMatrix[0].step + -3))->step + -3))->step
                                + 0xfffffffffffffffd) + lVar16));
    lVar16 = lVar16 + -0x60;
  } while (lVar16 != -0x60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&goodImageList);
  std::
  vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  ::~vector(&objectPoints);
  lVar16 = 0x18;
  do {
    std::
    vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
    ::~vector((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               *)((long)&imagePoints[0].
                         super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar16));
    lVar16 = lVar16 + -0x18;
  } while (lVar16 != -0x18);
  _Unwind_Resume(uVar14);
}

Assistant:

static void
StereoCalib(const vector<string>& imagelist, Size boardSize, float squareSize, bool displayCorners = false, bool useCalibrated=true, bool showRectified=true)
{
    if( imagelist.size() % 2 != 0 )
    {
        cout << "Error: the image list contains odd (non-even) number of elements\n";
        return;
    }

    const int maxScale = 2;
    // ARRAY AND VECTOR STORAGE:

    vector<vector<Point2f> > imagePoints[2];
    vector<vector<Point3f> > objectPoints;
    Size imageSize;

    int i, j, k, nimages = (int)imagelist.size()/2;

    imagePoints[0].resize(nimages);
    imagePoints[1].resize(nimages);
    vector<string> goodImageList;

    for( i = j = 0; i < nimages; i++ )
    {
        for( k = 0; k < 2; k++ )
        {
            const string& filename = imagelist[i*2+k];
            Mat img = imread(filename, 0);
            if(img.empty())
                break;
            if( imageSize == Size() )
                imageSize = img.size();
            else if( img.size() != imageSize )
            {
                cout << "The image " << filename << " has the size different from the first image size. Skipping the pair\n";
                break;
            }
            bool found = false;
            vector<Point2f>& corners = imagePoints[k][j];
            for( int scale = 1; scale <= maxScale; scale++ )
            {
                Mat timg;
                if( scale == 1 )
                    timg = img;
                else
                    resize(img, timg, Size(), scale, scale, INTER_LINEAR_EXACT);
                found = findChessboardCorners(timg, boardSize, corners,
                    CALIB_CB_ADAPTIVE_THRESH | CALIB_CB_NORMALIZE_IMAGE);
                if( found )
                {
                    if( scale > 1 )
                    {
                        Mat cornersMat(corners);
                        cornersMat *= 1./scale;
                    }
                    break;
                }
            }
            if( displayCorners )
            {
                cout << filename << endl;
                Mat cimg, cimg1;
                cvtColor(img, cimg, COLOR_GRAY2BGR);
                drawChessboardCorners(cimg, boardSize, corners, found);
                double sf = 640./MAX(img.rows, img.cols);
                resize(cimg, cimg1, Size(), sf, sf, INTER_LINEAR_EXACT);
                imshow("corners", cimg1);
                char c = (char)waitKey(500);
                if( c == 27 || c == 'q' || c == 'Q' ) //Allow ESC to quit
                    exit(-1);
            }
            else
                putchar('.');
            if( !found )
                break;
            cornerSubPix(img, corners, Size(11,11), Size(-1,-1),
                         TermCriteria(TermCriteria::COUNT+TermCriteria::EPS,
                                      30, 0.01));
        }
        if( k == 2 )
        {
            goodImageList.push_back(imagelist[i*2]);
            goodImageList.push_back(imagelist[i*2+1]);
            j++;
        }
    }
    cout << j << " pairs have been successfully detected.\n";
    nimages = j;
    if( nimages < 2 )
    {
        cout << "Error: too little pairs to run the calibration\n";
        return;
    }

    imagePoints[0].resize(nimages);
    imagePoints[1].resize(nimages);
    objectPoints.resize(nimages);

    for( i = 0; i < nimages; i++ )
    {
        for( j = 0; j < boardSize.height; j++ )
            for( k = 0; k < boardSize.width; k++ )
                objectPoints[i].push_back(Point3f(k*squareSize, j*squareSize, 0));
    }

    cout << "Running stereo calibration ...\n";

    Mat cameraMatrix[2], distCoeffs[2];
    cameraMatrix[0] = initCameraMatrix2D(objectPoints,imagePoints[0],imageSize,0);
    cameraMatrix[1] = initCameraMatrix2D(objectPoints,imagePoints[1],imageSize,0);
    Mat R, T, E, F;

    double rms = stereoCalibrate(objectPoints, imagePoints[0], imagePoints[1],
                    cameraMatrix[0], distCoeffs[0],
                    cameraMatrix[1], distCoeffs[1],
                    imageSize, R, T, E, F,
                    CALIB_FIX_ASPECT_RATIO +
                    CALIB_ZERO_TANGENT_DIST +
                    CALIB_USE_INTRINSIC_GUESS +
                    CALIB_SAME_FOCAL_LENGTH +
                    CALIB_RATIONAL_MODEL +
                    CALIB_FIX_K3 + CALIB_FIX_K4 + CALIB_FIX_K5,
                    TermCriteria(TermCriteria::COUNT+TermCriteria::EPS, 100, 1e-5) );
    cout << "done with RMS error=" << rms << endl;

// CALIBRATION QUALITY CHECK
// because the output fundamental matrix implicitly
// includes all the output information,
// we can check the quality of calibration using the
// epipolar geometry constraint: m2^t*F*m1=0
    double err = 0;
    int npoints = 0;
    vector<Vec3f> lines[2];
    for( i = 0; i < nimages; i++ )
    {
        int npt = (int)imagePoints[0][i].size();
        Mat imgpt[2];
        for( k = 0; k < 2; k++ )
        {
            imgpt[k] = Mat(imagePoints[k][i]);
            undistortPoints(imgpt[k], imgpt[k], cameraMatrix[k], distCoeffs[k], Mat(), cameraMatrix[k]);
            computeCorrespondEpilines(imgpt[k], k+1, F, lines[k]);
        }
        for( j = 0; j < npt; j++ )
        {
            double errij = fabs(imagePoints[0][i][j].x*lines[1][j][0] +
                                imagePoints[0][i][j].y*lines[1][j][1] + lines[1][j][2]) +
                           fabs(imagePoints[1][i][j].x*lines[0][j][0] +
                                imagePoints[1][i][j].y*lines[0][j][1] + lines[0][j][2]);
            err += errij;
        }
        npoints += npt;
    }
    cout << "average epipolar err = " <<  err/npoints << endl;

    // save intrinsic parameters
    FileStorage fs("intrinsics.yml", FileStorage::WRITE);
    if( fs.isOpened() )
    {
        fs << "M1" << cameraMatrix[0] << "D1" << distCoeffs[0] <<
            "M2" << cameraMatrix[1] << "D2" << distCoeffs[1];
        fs.release();
    }
    else
        cout << "Error: can not save the intrinsic parameters\n";

    Mat R1, R2, P1, P2, Q;
    Rect validRoi[2];

    stereoRectify(cameraMatrix[0], distCoeffs[0],
                  cameraMatrix[1], distCoeffs[1],
                  imageSize, R, T, R1, R2, P1, P2, Q,
                  CALIB_ZERO_DISPARITY, 1, imageSize, &validRoi[0], &validRoi[1]);

    fs.open("extrinsics.yml", FileStorage::WRITE);
    if( fs.isOpened() )
    {
        fs << "R" << R << "T" << T << "R1" << R1 << "R2" << R2 << "P1" << P1 << "P2" << P2 << "Q" << Q;
        fs.release();
    }
    else
        cout << "Error: can not save the extrinsic parameters\n";

    // OpenCV can handle left-right
    // or up-down camera arrangements
    bool isVerticalStereo = fabs(P2.at<double>(1, 3)) > fabs(P2.at<double>(0, 3));

// COMPUTE AND DISPLAY RECTIFICATION
    if( !showRectified )
        return;

    Mat rmap[2][2];
// IF BY CALIBRATED (BOUGUET'S METHOD)
    if( useCalibrated )
    {
        // we already computed everything
    }
// OR ELSE HARTLEY'S METHOD
    else
 // use intrinsic parameters of each camera, but
 // compute the rectification transformation directly
 // from the fundamental matrix
    {
        vector<Point2f> allimgpt[2];
        for( k = 0; k < 2; k++ )
        {
            for( i = 0; i < nimages; i++ )
                std::copy(imagePoints[k][i].begin(), imagePoints[k][i].end(), back_inserter(allimgpt[k]));
        }
        F = findFundamentalMat(Mat(allimgpt[0]), Mat(allimgpt[1]), FM_8POINT, 0, 0);
        Mat H1, H2;
        stereoRectifyUncalibrated(Mat(allimgpt[0]), Mat(allimgpt[1]), F, imageSize, H1, H2, 3);

        R1 = cameraMatrix[0].inv()*H1*cameraMatrix[0];
        R2 = cameraMatrix[1].inv()*H2*cameraMatrix[1];
        P1 = cameraMatrix[0];
        P2 = cameraMatrix[1];
    }

    //Precompute maps for cv::remap()
    initUndistortRectifyMap(cameraMatrix[0], distCoeffs[0], R1, P1, imageSize, CV_16SC2, rmap[0][0], rmap[0][1]);
    initUndistortRectifyMap(cameraMatrix[1], distCoeffs[1], R2, P2, imageSize, CV_16SC2, rmap[1][0], rmap[1][1]);

    Mat canvas;
    Mat canvas_orig;
    double sf;
    int w, h;
    if( !isVerticalStereo )
    {
        sf = 600./MAX(imageSize.width, imageSize.height);
        w = cvRound(imageSize.width*sf);
        h = cvRound(imageSize.height*sf);
        canvas.create(h, w*2, CV_8UC3);
        canvas_orig.create(h, w*2, CV_8UC3);
    }
    else
    {
        sf = 300./MAX(imageSize.width, imageSize.height);
        w = cvRound(imageSize.width*sf);
        h = cvRound(imageSize.height*sf);
        canvas.create(h*2, w, CV_8UC3);
        canvas_orig.create(h*2, w, CV_8UC3);
    }

    for( i = 0; i < nimages; i++ )
    {
        for( k = 0; k < 2; k++ )
        {
            Mat img = imread(goodImageList[i*2+k], 0), rimg, cimg, gimg;
            remap(img, rimg, rmap[k][0], rmap[k][1], INTER_LINEAR);
            cvtColor(rimg, cimg, COLOR_GRAY2BGR);
            cvtColor(img, gimg, COLOR_GRAY2BGR);
            Mat canvasPart = !isVerticalStereo ? canvas(Rect(w*k, 0, w, h)) : canvas(Rect(0, h*k, w, h));
            Mat canvasPart_orig = !isVerticalStereo ? canvas_orig(Rect(w*k, 0, w, h)) : canvas_orig(Rect(0, h*k, w, h));
            resize(cimg, canvasPart, canvasPart.size(), 0, 0, INTER_AREA);
            resize(gimg, canvasPart_orig, canvasPart_orig.size(), 0, 0, INTER_AREA);
            if( useCalibrated )
            {
                Rect vroi(cvRound(validRoi[k].x*sf), cvRound(validRoi[k].y*sf),
                          cvRound(validRoi[k].width*sf), cvRound(validRoi[k].height*sf));
                rectangle(canvasPart, vroi, Scalar(0,0,255), 3, 8);
                rectangle(canvasPart_orig, vroi, Scalar(0,0,255), 3, 8);
            }
        }

        if( !isVerticalStereo )
            for( j = 0; j < canvas.rows; j += 16 )
            {
                line(canvas, Point(0, j), Point(canvas.cols, j), Scalar(0, 255, 0), 1, 8);
                line(canvas_orig, Point(0, j), Point(canvas_orig.cols, j), Scalar(0, 255, 0), 1, 8);
            }
        else
            for( j = 0; j < canvas.cols; j += 16 )
            {
                line(canvas, Point(j, 0), Point(j, canvas.rows), Scalar(0, 255, 0), 1, 8);
                line(canvas_orig, Point(j, 0), Point(j, canvas_orig.rows), Scalar(0, 255, 0), 1, 8);
            }
        imshow("rectified", canvas);
        imshow("unrectified", canvas_orig);
        char c = (char)waitKey();
        if( c == 27 || c == 'q' || c == 'Q' )
            break;
    }
}